

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::GenerateNonNestedInitializationCode
          (ExtensionGenerator *this,Printer *printer)

{
  java *this_00;
  FieldDescriptor *pFVar1;
  long *plVar2;
  int i;
  FieldDescriptor *in_RDX;
  string local_50;
  string local_30;
  
  this_00 = (java *)this->descriptor_;
  if ((*(long *)(this_00 + 0x40) == 0) &&
     (*(int *)(*(long *)(*(long *)(this_00 + 0x20) + 0x88) + 0x50) != 3)) {
    UnderscoresToCamelCase_abi_cxx11_(&local_30,this_00,in_RDX);
    pFVar1 = this->descriptor_;
    if (pFVar1[0x34] == (FieldDescriptor)0x0) {
      plVar2 = (long *)(*(long *)(pFVar1 + 0x38) + 0x30);
    }
    else if (*(long *)(pFVar1 + 0x40) == 0) {
      plVar2 = (long *)(*(long *)(pFVar1 + 0x20) + 0x80);
    }
    else {
      plVar2 = (long *)(*(long *)(pFVar1 + 0x40) + 0x70);
    }
    SimpleItoa_abi_cxx11_
              (&local_50,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pFVar1 - *plVar2) >> 3) * -0x11111111),
               i);
    io::Printer::Print(printer,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
                       "name",&local_30,"index",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  if (descriptor_->extension_scope() == NULL &&
      HasDescriptorMethods(descriptor_->file())) {
    // Only applies to non-nested, non-lite extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCase(descriptor_),
        "index", SimpleItoa(descriptor_->index()));
  }
}